

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

void __thiscall Map::SpellGroup(Map *this,Character *from,unsigned_short spell_id)

{
  list<Character_*,_std::allocator<Character_*>_> *plVar1;
  unsigned_short uVar2;
  World *pWVar3;
  Character *this_00;
  bool bVar4;
  int iVar5;
  ESF_Data *pEVar6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  short sVar9;
  undefined6 in_register_00000012;
  unsigned_short num;
  pointer ppCVar10;
  int iVar11;
  pointer ppCVar12;
  uchar num_00;
  ushort uVar13;
  _List_node_base *p_Var14;
  allocator local_d9;
  Character *local_d8;
  Map *local_d0;
  World *local_c8;
  pointer local_c0;
  ESF_Data *local_b8;
  set<Character_*,_std::less<Character_*>,_std::allocator<Character_*>_> in_range;
  PacketBuilder builder;
  Character *character;
  
  local_d8 = from;
  local_d0 = this;
  pEVar6 = ESF::Get(from->world->esf,(uint)CONCAT62(in_register_00000012,spell_id));
  if (pEVar6->id == 0) {
    return;
  }
  if (pEVar6->type != Heal) {
    return;
  }
  if (local_d8->party == (Party *)0x0) {
    return;
  }
  if (local_d8->tp < pEVar6->tp) {
    return;
  }
  local_d8->tp = local_d8->tp - pEVar6->tp;
  uVar2 = pEVar6->hp;
  num = uVar2;
  if ((local_d8->nointeract & 4U) != 0) {
    if ((local_d8->nointeract & 0x20U) == 0) {
      if (local_d8->map->pk != false) goto LAB_001725c6;
      pWVar3 = local_d0->world;
      std::__cxx11::string::string((string *)&in_range,"GlobalPK",(allocator *)&builder);
      pmVar7 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar3->config,(key_type *)&in_range);
      bVar4 = util::variant::GetBool(pmVar7);
      if (bVar4) {
        bVar4 = World::PKExcept(local_d0->world,(int)local_d0->id);
        std::__cxx11::string::~string((string *)&in_range);
        if (!bVar4) goto LAB_001725c6;
      }
      else {
        std::__cxx11::string::~string((string *)&in_range);
      }
    }
    num = 1;
    if ((short)uVar2 < 1) {
      num = uVar2;
    }
  }
LAB_001725c6:
  in_range._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &in_range._M_t._M_impl.super__Rb_tree_header._M_header;
  in_range._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  in_range._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  in_range._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  in_range._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       in_range._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  PacketBuilder::PacketBuilder
            (&builder,PACKET_SPELL,PACKET_TARGET_GROUP,
             ((long)(local_d8->party->members).
                    super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(local_d8->party->members).
                    super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * 10 + 8);
  local_b8 = pEVar6;
  PacketBuilder::AddShort(&builder,spell_id);
  PacketBuilder::AddShort(&builder,(unsigned_short)local_d8->player->id);
  PacketBuilder::AddShort(&builder,local_d8->tp);
  PacketBuilder::AddShort(&builder,num);
  ppCVar10 = (local_d8->party->members).
             super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppCVar12 = (local_d8->party->members).
             super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  plVar1 = &local_d0->characters;
  local_c0 = ppCVar12;
  do {
    if (ppCVar10 == ppCVar12) {
      for (p_Var8 = in_range._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 != &in_range._M_t._M_impl.super__Rb_tree_header;
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        Character::Send(*(Character **)(p_Var8 + 1),&builder);
      }
      PacketBuilder::~PacketBuilder(&builder);
      std::
      _Rb_tree<Character_*,_Character_*,_std::_Identity<Character_*>,_std::less<Character_*>,_std::allocator<Character_*>_>
      ::~_Rb_tree(&in_range._M_t);
      return;
    }
    this_00 = *ppCVar10;
    if (this_00->map == local_d8->map) {
      iVar11 = (int)local_b8->hp;
      pWVar3 = local_d0->world;
      std::__cxx11::string::string((string *)&character,"LimitDamage",&local_d9);
      pmVar7 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar3->config,(key_type *)&character);
      bVar4 = util::variant::GetBool(pmVar7);
      std::__cxx11::string::~string((string *)&character);
      if ((bVar4) && (iVar5 = (int)this_00->maxhp - (int)this_00->hp, iVar5 < iVar11)) {
        iVar11 = iVar5;
      }
      uVar13 = 0;
      if (0 < iVar11) {
        uVar13 = (ushort)iVar11;
      }
      if ((local_d8->nointeract & 4U) != 0) {
        if ((local_d8->nointeract & 0x20U) == 0) {
          if (local_d8->map->pk != false) goto LAB_001727c7;
          local_c8 = local_d0->world;
          std::__cxx11::string::string((string *)&character,"GlobalPK",&local_d9);
          pmVar7 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&local_c8->config,(key_type *)&character);
          bVar4 = util::variant::GetBool(pmVar7);
          if (bVar4) {
            bVar4 = World::PKExcept(local_d0->world,(int)local_d0->id);
            local_c8 = (World *)CONCAT71(local_c8._1_7_,bVar4);
            std::__cxx11::string::~string((string *)&character);
            if ((char)local_c8 == '\0') goto LAB_001727c7;
          }
          else {
            std::__cxx11::string::~string((string *)&character);
          }
        }
        uVar13 = (ushort)(0 < iVar11);
      }
LAB_001727c7:
      this_00->hp = this_00->hp + uVar13;
      pWVar3 = local_d0->world;
      std::__cxx11::string::string((string *)&character,"LimitDamage",&local_d9);
      pmVar7 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar3->config,(key_type *)&character);
      ppCVar12 = local_c0;
      bVar4 = util::variant::GetBool(pmVar7);
      std::__cxx11::string::~string((string *)&character);
      if (!bVar4) {
        sVar9 = this_00->hp;
        if (this_00->maxhp < this_00->hp) {
          sVar9 = this_00->maxhp;
        }
        this_00->hp = sVar9;
      }
      PacketBuilder::AddByte(&builder,0xff);
      PacketBuilder::AddByte(&builder,0xff);
      PacketBuilder::AddByte(&builder,0xff);
      PacketBuilder::AddByte(&builder,0xff);
      PacketBuilder::AddByte(&builder,0xff);
      PacketBuilder::AddShort(&builder,(unsigned_short)this_00->player->id);
      iVar11 = (int)(((double)(int)this_00->hp / (double)(int)this_00->maxhp) * 100.0);
      if (iVar11 < 1) {
        iVar11 = 0;
      }
      num_00 = (uchar)iVar11;
      if (99 < iVar11) {
        num_00 = 'd';
      }
      PacketBuilder::AddChar(&builder,num_00);
      PacketBuilder::AddShort(&builder,this_00->hp);
      p_Var14 = (_List_node_base *)plVar1;
      while (p_Var14 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var14->_M_next)
                       ->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var14 != (_List_node_base *)plVar1) {
        character = (Character *)p_Var14[1]._M_next;
        bVar4 = Character::InRange(this_00,character);
        if (bVar4) {
          std::
          _Rb_tree<Character*,Character*,std::_Identity<Character*>,std::less<Character*>,std::allocator<Character*>>
          ::_M_insert_unique<Character*const&>
                    ((_Rb_tree<Character*,Character*,std::_Identity<Character*>,std::less<Character*>,std::allocator<Character*>>
                      *)&in_range,&character);
        }
      }
    }
    ppCVar10 = ppCVar10 + 1;
  } while( true );
}

Assistant:

void Map::SpellGroup(Character *from, unsigned short spell_id)
{
	const ESF_Data &spell = from->world->esf->Get(spell_id);

	if (!spell || spell.type != ESF::Heal || !from->party || from->tp < spell.tp)
		return;

	from->tp -= spell.tp;

	int displayhp = spell.hp;

	if (!from->CanInteractCombat() && !(from->CanInteractPKCombat() && (from->map->pk || (this->world->config["GlobalPK"] && !this->world->PKExcept(this->id)))))
	{
		displayhp = std::min(displayhp, 1);
	}

	std::set<Character *> in_range;

	PacketBuilder builder(PACKET_SPELL, PACKET_TARGET_GROUP, 8 + from->party->members.size() * 10);
	builder.AddShort(spell_id);
	builder.AddShort(from->PlayerID());
	builder.AddShort(from->tp);
	builder.AddShort(displayhp);

	UTIL_FOREACH(from->party->members, member)
	{
		if (member->map != from->map)
			continue;

		int displayhp = spell.hp;
		int hpgain = spell.hp;

		if (this->world->config["LimitDamage"])
			hpgain = std::min(hpgain, member->maxhp - member->hp);

		hpgain = std::max(hpgain, 0);

		if (!from->CanInteractCombat() && !(from->CanInteractPKCombat() && (from->map->pk || (this->world->config["GlobalPK"] && !this->world->PKExcept(this->id)))))
			hpgain = std::min(hpgain, 1);

		member->hp += hpgain;

		if (!this->world->config["LimitDamage"])
			member->hp = std::min(member->hp, member->maxhp);

		// wat?
		builder.AddByte(255);
		builder.AddByte(255);
		builder.AddByte(255);
		builder.AddByte(255);
		builder.AddByte(255);

		builder.AddShort(member->PlayerID());
		builder.AddChar(util::clamp<int>(double(member->hp) / double(member->maxhp) * 100.0, 0, 100));
		builder.AddShort(member->hp);

		UTIL_FOREACH(this->characters, character)
		{
			if (member->InRange(character))
				in_range.insert(character);
		}
	}

	UTIL_FOREACH(in_range, character)
	{
		character->Send(builder);
	}
}